

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

Blob<224> * bitreverse<Blob<224>>(Blob<224> *__return_storage_ptr__,Blob<224> *n,size_t b)

{
  bool bVar1;
  Blob<224> local_68;
  Blob<224> local_4c;
  
  Blob<224>::Blob(__return_storage_ptr__,0);
  while (bVar1 = b != 0, b = b - 1, bVar1) {
    Blob<224>::operator<<(&local_68,__return_storage_ptr__,1);
    Blob<224>::Blob(&local_4c,*(uint *)n->bytes & 1 | local_68.bytes._0_4_);
    Blob<224>::operator=(__return_storage_ptr__,&local_4c);
    Blob<224>::operator>>=(n,1);
  }
  return __return_storage_ptr__;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; ++i, n >>= 1) {
        rv = (rv << 1) | (n & 0x01);
    }
    return rv;
}